

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void pixels::compareExact(uint32_t a,uint32_t b,int x,int y,char *taga,char *tagb,char *chan)

{
  ostream *poVar1;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  uint in_EDI;
  char *in_R8;
  char *in_R9;
  char *in_stack_ffffffffffffffd8;
  uint line;
  
  if (in_EDI != in_ESI) {
    poVar1 = std::operator<<((ostream *)&std::cout,tagb);
    poVar1 = std::operator<<(poVar1," uint at ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ECX);
    poVar1 = std::operator<<(poVar1," not equal: ");
    poVar1 = std::operator<<(poVar1,in_R8);
    poVar1 = std::operator<<(poVar1," 0x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = std::operator<<(poVar1," vs ");
    poVar1 = std::operator<<(poVar1,in_R9);
    line = (uint)((ulong)in_R9 >> 0x20);
    poVar1 = std::operator<<(poVar1," 0x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_EDX,in_ECX),in_R8,line,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static inline void compareExact (
        uint32_t    a,
        uint32_t    b,
        int         x,
        int         y,
        const char* taga,
        const char* tagb,
        const char* chan)
    {
        if (a != b)
        {
            std::cout << chan << " uint at " << x << ", " << y
                      << " not equal: " << taga << " 0x" << std::hex << a
                      << std::dec << " vs " << tagb << " 0x" << std::hex << b
                      << std::dec << std::endl;
        }
        EXRCORE_TEST (a == b);
    }